

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O3

void sense_trap(trap *trap,xchar x,xchar y,int src_cursed)

{
  boolean bVar1;
  int iVar2;
  long lVar3;
  obj *poVar4;
  obj *poVar5;
  byte bVar6;
  trap temp_trap;
  obj oStack_88;
  
  bVar6 = 0;
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
    if (src_cursed == 0) goto LAB_001612c0;
  }
  else if (((u.umonnum != u.umonster) && (bVar1 = dmgtype(youmonst.data,0x24), src_cursed == 0)) &&
          (bVar1 != '\0')) {
LAB_001612c0:
    if (trap != (trap *)0x0) {
      map_trap(trap,1);
      trap->field_0x8 = trap->field_0x8 | 0x20;
      return;
    }
    oStack_88.v._0_1_ = 5;
    oStack_88.v._1_1_ = x;
    oStack_88.v._2_1_ = y;
    map_trap((trap *)&oStack_88,1);
    return;
  }
  poVar4 = &zeroobj;
  poVar5 = &oStack_88;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    poVar5->nobj = poVar4->nobj;
    poVar4 = (obj *)((long)poVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    poVar5 = (obj *)((long)poVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  if (trap != (trap *)0x0) {
    x = trap->tx;
    y = trap->ty;
  }
  oStack_88.otyp = 0x1ef;
  oStack_88.ox = x;
  oStack_88.oy = y;
  if (src_cursed == 0) {
    iVar2 = display_rng(0x219);
    oStack_88.otyp = (short)iVar2 + 1;
  }
  oStack_88.corpsenm = display_rng(0x193);
  map_object(&oStack_88,1);
  return;
}

Assistant:

static void sense_trap(struct trap *trap, xchar x, xchar y, int src_cursed)
{
    if (Hallucination || src_cursed) {
	struct obj obj;			/* fake object */
	obj = zeroobj;
	if (trap) {
	    obj.ox = trap->tx;
	    obj.oy = trap->ty;
	} else {
	    obj.ox = x;
	    obj.oy = y;
	}
	obj.otyp = (src_cursed) ? GOLD_PIECE : random_object();
	obj.corpsenm = random_monster();	/* if otyp == CORPSE */
	map_object(&obj,1);
    } else if (trap) {
	map_trap(trap,1);
	trap->tseen = 1;
    } else {
	struct trap temp_trap;		/* fake trap */
	temp_trap.tx = x;
	temp_trap.ty = y;
	temp_trap.ttyp = BEAR_TRAP;	/* some kind of trap */
	map_trap(&temp_trap, 1);
    }

}